

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)5>_>
          (xpath_ast_node *this,xml_node_struct *ns,long *xn,undefined8 param_4,byte once)

{
  bool bVar1;
  xml_node xVar2;
  xml_node_struct *alloc;
  xml_node_struct *alloc_00;
  xml_node local_38;
  
  if (xn[1] == 0) {
    xVar2._root = (xml_node_struct *)*xn;
  }
  else {
    xml_node::xml_node(&local_38);
    xVar2._root = local_38._root;
  }
  if (xVar2._root == (xml_node_struct *)0x0) {
    if ((((xml_node_struct *)xn[1] != (xml_node_struct *)0x0) &&
        ((xpath_allocator *)*xn != (xpath_allocator *)0x0)) && (this->_test == '\x02')) {
      step_push((xpath_ast_node *)0x2,(xpath_node_set_raw *)(this->_data).variable,
                (xml_attribute_struct *)ns,(xml_node_struct *)xn[1],(xpath_allocator *)*xn);
    }
  }
  else {
    if (xn[1] == 0) {
      xVar2._root = (xml_node_struct *)*xn;
    }
    else {
      xml_node::xml_node(&local_38);
      xVar2._root = local_38._root;
    }
    bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                      (xpath_node_set_raw *)(this->_data).variable,ns,(xpath_allocator *)xVar2._root
                     );
    if (((bVar1 & once) == 0) &&
       (alloc_00 = (xVar2._root)->first_child, alloc_00 != (xml_node_struct *)0x0)) {
      bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                        (xpath_node_set_raw *)(this->_data).variable,ns,(xpath_allocator *)alloc_00)
      ;
      while ((bVar1 & once) == 0) {
        alloc = alloc_00->first_child;
        if (alloc == (xml_node_struct *)0x0) {
          while (alloc = alloc_00->next_sibling, alloc == (xml_node_struct *)0x0) {
            alloc_00 = alloc_00->parent;
            if (alloc_00 == xVar2._root) {
              return;
            }
          }
        }
        bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                          (xpath_node_set_raw *)(this->_data).variable,ns,(xpath_allocator *)alloc);
        alloc_00 = alloc;
      }
    }
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}